

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::ScopeInfo*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::ScopeInfo*>
          (BaseDictionary<Js::ScopeInfo*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,ScopeInfo **key)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  DictionaryStats *this_00;
  int iVar4;
  
  lVar2 = *(long *)this;
  if (lVar2 == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = BaseDictionary<Js::ScopeInfo_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<Js::ScopeInfo_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,(uint)((ulong)*key >> 3) | 1);
    piVar3 = (int *)(lVar2 + (ulong)uVar1 * 4);
    uVar1 = 0;
    while( true ) {
      iVar4 = *piVar3;
      if ((long)iVar4 < 0) break;
      lVar2 = (long)iVar4 * 0x10;
      if (*(ScopeInfo **)(*(long *)(this + 8) + 8 + lVar2) == *key) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_007b56ec;
      }
      uVar1 = uVar1 + 1;
      piVar3 = (int *)(lVar2 + *(long *)(this + 8) + 4);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar4 = -1;
LAB_007b56ec:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar1);
  }
  return iVar4;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }